

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SeedTest<unsigned_long>(pfHash hash,int keycount,bool drawDiagram)

{
  undefined4 uVar1;
  char *pcVar2;
  bool bVar3;
  size_t sVar4;
  reference pvVar5;
  byte in_DL;
  uint in_ESI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  bool result;
  int i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  bool in_stack_0000005b;
  int len;
  char *text;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffa0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__new_size;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  byte bVar6;
  int local_48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  undefined4 local_1c;
  char *local_18;
  byte local_d;
  uint local_c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_8;
  
  local_d = in_DL & 1;
  local_c = in_ESI;
  local_8 = in_RDI;
  printf("Keyset \'Seed\' - %d keys\n",(ulong)in_ESI);
  local_18 = "The quick brown fox jumps over the lazy dog";
  sVar4 = strlen("The quick brown fox jumps over the lazy dog");
  local_1c = (undefined4)sVar4;
  __new_size = &local_38;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x14e940);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),(size_type)__new_size);
  for (local_48 = 0; pcVar2 = local_18, uVar1 = local_1c, local_48 < (int)local_c;
      local_48 = local_48 + 1) {
    in_stack_ffffffffffffffa0 = local_8;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_38,(long)local_48);
    (*(code *)in_stack_ffffffffffffffa0)(pcVar2,uVar1,local_48,pvVar5);
  }
  bVar6 = 1;
  bVar3 = TestHashList<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)text,len._3_1_,
                     len._2_1_,len._1_1_,len._0_1_,in_stack_0000005b);
  bVar6 = bVar3 & bVar6;
  printf("\n");
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffffa0);
  return (bool)(bVar6 & 1);
}

Assistant:

bool SeedTest ( pfHash hash, int keycount, bool drawDiagram )
{
  printf("Keyset 'Seed' - %d keys\n",keycount);

  const char * text = "The quick brown fox jumps over the lazy dog";
  const int len = (int)strlen(text);

  //----------

  std::vector<hashtype> hashes;

  hashes.resize(keycount);

  for(int i = 0; i < keycount; i++)
  {
    hash(text,len,i,&hashes[i]);
  }

  bool result = true;

  result &= TestHashList(hashes,drawDiagram);

  printf("\n");

  return result;
}